

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

exr_result_t internal_exr_apply_zip(exr_encode_pipeline_t *encode)

{
  long lVar1;
  exr_result_t eVar2;
  long in_RDI;
  size_t *unaff_retaddr;
  exr_const_context_t pctxt;
  exr_result_t rv;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = internal_encode_alloc_buffer
                    (encode,rv,(void **)pctxt,unaff_retaddr,
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (eVar2 == 0) {
    eVar2 = apply_zip_impl((exr_encode_pipeline_t *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x18);
    if (lVar1 != 0) {
      (**(code **)(lVar1 + 0x48))
                (lVar1,eVar2,"Unable to allocate scratch buffer for deflate of %lu bytes",
                 *(undefined8 *)(in_RDI + 0x70));
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_apply_zip (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        encode->packed_bytes);
    if (rv != EXR_ERR_SUCCESS)
    {
        exr_const_context_t pctxt = encode->context;
        if (pctxt)
            pctxt->print_error (
                pctxt,
                rv,
                "Unable to allocate scratch buffer for deflate of %" PRIu64
                " bytes",
                encode->packed_bytes);
        return rv;
    }

    return apply_zip_impl (encode);
}